

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<VectorWriter,unsigned_int,unsigned_long>
               (VectorWriter *s,uint *args,unsigned_long *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  VectorWriter *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<VectorWriter>(in_stack_ffffffffffffffd8,0);
  Serialize<VectorWriter>(in_stack_ffffffffffffffd8,0x10c43d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}